

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_symbol_internWithString(sysbvm_context_t *context,size_t stringSize,char *string)

{
  _Bool _Var1;
  size_t newIdentityHash;
  sysbvm_object_tuple_t *result;
  sysbvm_tuple_t existent;
  sysbvm_stringSlice_t stringSlice;
  char *string_local;
  size_t stringSize_local;
  sysbvm_context_t *context_local;
  
  existent = (sysbvm_tuple_t)string;
  stringSlice.elements = (char *)stringSize;
  stringSlice.size = (size_t)string;
  _Var1 = sysbvm_identitySet_findWithExplicitHash
                    (context,(context->roots).internedSymbolSet,&existent,
                     sysbvm_stringSliceSymbol_hashFunction,sysbvm_stringSlice_equalsFunction,
                     (sysbvm_tuple_t *)&result);
  if (_Var1) {
    context_local = (sysbvm_context_t *)result;
  }
  else {
    context_local =
         (sysbvm_context_t *)
         sysbvm_context_allocateByteTuple(context,(context->roots).stringSymbolType,stringSize);
    if (context_local == (sysbvm_context_t *)0x0) {
      context_local = (sysbvm_context_t *)0x0;
    }
    else {
      newIdentityHash = sysbvm_string_computeHashWithBytes(stringSize,(uint8_t *)stringSlice.size);
      sysbvm_tuple_setIdentityHash((sysbvm_object_tuple_t *)context_local,newIdentityHash);
      memcpy((anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)
             &(context_local->heap).shouldAttemptToCollect,(void *)stringSlice.size,stringSize);
      sysbvm_identitySet_insert
                (context,(context->roots).internedSymbolSet,(sysbvm_tuple_t)context_local);
    }
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_symbol_internWithString(sysbvm_context_t *context, size_t stringSize, const char *string)
{
    {
        sysbvm_stringSlice_t stringSlice = {
            .elements = string,
            .size = stringSize
        };

        sysbvm_tuple_t existent;
        if(sysbvm_identitySet_findWithExplicitHash(context, context->roots.internedSymbolSet, &stringSlice, sysbvm_stringSliceSymbol_hashFunction, sysbvm_stringSlice_equalsFunction, &existent))
            return existent;
    }

    sysbvm_object_tuple_t *result = sysbvm_context_allocateByteTuple(context, context->roots.stringSymbolType, stringSize);
    if(!result) return 0;

    // In the case of symbols, make the identity hash match with the string hash.
    sysbvm_tuple_setIdentityHash(result, sysbvm_string_computeHashWithBytes(stringSize, (const uint8_t*)string));

    memcpy(result->bytes, string, stringSize);
    sysbvm_identitySet_insert(context, context->roots.internedSymbolSet, (sysbvm_tuple_t)result);
    return (sysbvm_tuple_t)result;
}